

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pybind11.h
# Opt level: O0

class_<anurbs::KnotRefinement<2L>_> * __thiscall
pybind11::class_<anurbs::KnotRefinement<2l>>::
def_static<std::shared_ptr<anurbs::NurbsCurveGeometry<2l>>(*)(anurbs::NurbsCurveGeometry<2l>const&,std::vector<double,std::allocator<double>>),pybind11::arg,pybind11::arg>
          (class_<anurbs::KnotRefinement<2l>> *this,char *name_,
          _func_shared_ptr<anurbs::NurbsCurveGeometry<2L>_>_NurbsCurveGeometry<2L>_ptr_vector<double,_std::allocator<double>_>
          **f,arg *extra,arg *extra_1)

{
  _func_shared_ptr<anurbs::NurbsCurveGeometry<2L>_>_NurbsCurveGeometry<2L>_ptr_vector<double,_std::allocator<double>_>
  *f_00;
  handle local_b8;
  PyObject *local_b0;
  obj_attr_accessor local_a8;
  staticmethod local_88 [3];
  handle local_70;
  PyObject *local_68;
  handle local_60;
  handle local_58;
  sibling local_50;
  scope local_48;
  name local_40;
  cpp_function local_38;
  cpp_function cf;
  arg *extra_local_1;
  arg *extra_local;
  _func_shared_ptr<anurbs::NurbsCurveGeometry<2L>_>_NurbsCurveGeometry<2L>_ptr_vector<double,_std::allocator<double>_>
  **f_local;
  char *name__local;
  class_<anurbs::KnotRefinement<2L>_> *this_local;
  
  f_00 = *f;
  cf.super_function.super_object.super_handle.m_ptr = (function)(function)extra_1;
  pybind11::name::name(&local_40,name_);
  pybind11::scope::scope(&local_48,(handle *)this);
  local_60.m_ptr = *(PyObject **)this;
  none::none((none *)&local_70);
  local_68 = local_70.m_ptr;
  getattr((pybind11 *)&local_58,local_60,name_,local_70);
  sibling::sibling(&local_50,&local_58);
  cpp_function::
  cpp_function<std::shared_ptr<anurbs::NurbsCurveGeometry<2l>>,anurbs::NurbsCurveGeometry<2l>const&,std::vector<double,std::allocator<double>>,pybind11::name,pybind11::scope,pybind11::sibling,pybind11::arg,pybind11::arg>
            (&local_38,f_00,&local_40,&local_48,&local_50,extra,
             (arg *)cf.super_function.super_object.super_handle.m_ptr);
  pybind11::object::~object((object *)&local_58);
  none::~none((none *)&local_70);
  staticmethod::staticmethod(local_88,(object *)&local_38);
  cpp_function::name((cpp_function *)&local_b8);
  local_b0 = local_b8.m_ptr;
  detail::object_api<pybind11::handle>::attr
            (&local_a8,(object_api<pybind11::handle> *)this,local_b8);
  detail::accessor<pybind11::detail::accessor_policies::obj_attr>::operator=(&local_a8,local_88);
  detail::accessor<pybind11::detail::accessor_policies::obj_attr>::~accessor(&local_a8);
  pybind11::object::~object((object *)&local_b8);
  staticmethod::~staticmethod(local_88);
  cpp_function::~cpp_function(&local_38);
  return (class_<anurbs::KnotRefinement<2L>_> *)this;
}

Assistant:

class_ &
    def_static(const char *name_, Func &&f, const Extra&... extra) {
        static_assert(!std::is_member_function_pointer<Func>::value,
                "def_static(...) called with a non-static member function pointer");
        cpp_function cf(std::forward<Func>(f), name(name_), scope(*this),
                        sibling(getattr(*this, name_, none())), extra...);
        attr(cf.name()) = staticmethod(cf);
        return *this;
    }